

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O0

void spvPushOperandTypes(spv_operand_type_t *types,spv_operand_pattern_t *pattern)

{
  value_type *local_20;
  spv_operand_type_t *endTypes;
  spv_operand_pattern_t *pattern_local;
  spv_operand_type_t *types_local;
  
  for (local_20 = types; *local_20 != SPV_OPERAND_TYPE_NONE; local_20 = local_20 + 1) {
  }
  while (local_20 != types) {
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (pattern,local_20 + -1);
    local_20 = local_20 + -1;
  }
  return;
}

Assistant:

void spvPushOperandTypes(const spv_operand_type_t* types,
                         spv_operand_pattern_t* pattern) {
  const spv_operand_type_t* endTypes;
  for (endTypes = types; *endTypes != SPV_OPERAND_TYPE_NONE; ++endTypes) {
  }

  while (endTypes-- != types) {
    pattern->push_back(*endTypes);
  }
}